

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsObjectSetProperty(JsValueRef object,JsValueRef propertyId,JsValueRef value,bool useStrictRules)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  JsErrorCode exitStatus;
  JsrtContext *pJVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  undefined7 in_register_00000009;
  void *unaff_retaddr;
  undefined1 auStack_c8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 auStack_88 [8];
  TTDRecorder _actionEntryPopper;
  undefined1 local_70 [8];
  EnterScriptObject __enterScriptObject;
  PropertyRecord *local_40;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  auStack_88 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar5 = JsrtContext::GetCurrent();
  if (pJVar5 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
    goto LAB_00366ab4;
  }
  __enterScriptObject.library._4_4_ = (undefined4)CONCAT71(in_register_00000009,useStrictRules);
  scriptContext = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_c8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_70,scriptContext,(ScriptEntryExitRecord *)auStack_c8,
             unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_70);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x6a0,"(false)","Need to implement support here!!!");
    if (!bVar3) goto LAB_00366d85;
    *puVar6 = 0;
  }
  if (object == (JsValueRef)0x0) {
LAB_00366a94:
    exitStatus = JsErrorInvalidArgument;
LAB_00366aa2:
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_70);
  }
  else {
    BVar4 = Js::JavascriptOperators::IsObject(object);
    if (BVar4 == 0) {
      exitStatus = JsErrorArgumentNotObject;
      goto LAB_00366aa2;
    }
    pRVar7 = Js::VarTo<Js::RecyclableObject>(object);
    pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
    if (pSVar1 != scriptContext) {
      exitStatus = JsErrorWrongRuntime;
      if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00366aa2;
      object = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
    }
    if ((ulong)propertyId >> 0x30 != 0 || propertyId == (JsValueRef)0x0) goto LAB_00366a94;
    pRVar7 = Js::VarTo<Js::RecyclableObject>(propertyId);
    pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
    if (pSVar1 != scriptContext) {
      exitStatus = JsErrorWrongRuntime;
      if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00366aa2;
      propertyId = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
    }
    exitStatus = JsErrorInvalidArgument;
    if (value == (JsValueRef)0x0) goto LAB_00366aa2;
    if (value < &DAT_1000000000000) {
      pRVar7 = Js::VarTo<Js::RecyclableObject>(value);
      pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00366aa2;
        value = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
      }
    }
    local_40 = (PropertyRecord *)0x0;
    pRVar7 = Js::VarTo<Js::RecyclableObject>(propertyId);
    exitStatus = InternalGetPropertyRecord(scriptContext,pRVar7,&local_40);
    if (exitStatus != JsNoError) goto LAB_00366aa2;
    if (local_40 == (PropertyRecord *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                         ,0x6af,"(propertyRecord != nullptr)","propertyRecord != nullptr");
      if (!bVar3) {
LAB_00366d85:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    JsSetPropertyCommon(scriptContext,object,local_40,value,__enterScriptObject.library._4_1_);
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_70);
    exitStatus = JsNoError;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
LAB_00366ab4:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)auStack_88,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsObjectSetProperty(_In_ JsValueRef object, _In_ JsValueRef propertyId, _In_ JsValueRef value, _In_ bool useStrictRules)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(propertyId, scriptContext);
        VALIDATE_INCOMING_REFERENCE(value, scriptContext);

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(propertyId), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        Assert(propertyRecord != nullptr);

        return JsSetPropertyCommon(scriptContext, object, propertyRecord, value, useStrictRules);
    });
}